

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<double,2ul>>::
fit<pico_tree::internal::box<double,2ul>>
          (box_base<pico_tree::internal::box<double,_2UL>_> *this,
          box_base<pico_tree::internal::box<double,_2UL>_> *x)

{
  double dVar1;
  size_type i;
  
  for (i = 0; i != 2; i = i + 1) {
    if (*(double *)(x + i * 8) < *(double *)(this + i * 8)) {
      *(double *)(this + i * 8) = *(double *)(x + i * 8);
    }
    dVar1 = *(double *)(x + i * 8 + 0x10);
    if (*(double *)(this + i * 8 + 0x10) <= dVar1 && dVar1 != *(double *)(this + i * 8 + 0x10)) {
      *(double *)(this + i * 8 + 0x10) = dVar1;
    }
  }
  return;
}

Assistant:

constexpr void fit(box_base<OtherDerived_> const& x) {
    for (size_type i = 0; i < derived().size(); ++i) {
      if (x.min(i) < min(i)) {
        min(i) = x.min(i);
      }

      if (x.max(i) > max(i)) {
        max(i) = x.max(i);
      }
    }
  }